

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::DataSourceDescriptor::DataSourceDescriptor
          (DataSourceDescriptor *this,DataSourceDescriptor *param_1)

{
  DataSourceDescriptor *param_1_local;
  DataSourceDescriptor *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__DataSourceDescriptor_009c0a48;
  ::std::__cxx11::string::string((string *)&this->name_,(string *)&param_1->name_);
  *(undefined4 *)((long)&this->id_ + 7) = *(undefined4 *)((long)&param_1->id_ + 7);
  this->id_ = param_1->id_;
  ::std::__cxx11::string::string
            ((string *)&this->gpu_counter_descriptor_,(string *)&param_1->gpu_counter_descriptor_);
  ::std::__cxx11::string::string
            ((string *)&this->track_event_descriptor_,(string *)&param_1->track_event_descriptor_);
  ::std::__cxx11::string::string
            ((string *)&this->ftrace_descriptor_,(string *)&param_1->ftrace_descriptor_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

DataSourceDescriptor::DataSourceDescriptor(const DataSourceDescriptor&) = default;